

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostModel.cpp
# Opt level: O3

void __thiscall tiger::trains::models::PostModel::PostModel(PostModel *this)

{
  this->idx = 0;
  this->type = UNKNOWN;
  this->armor = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->population = 0;
  this->product = 0;
  (this->eventList).
  super__Vector_base<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eventList).
  super__Vector_base<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eventList).
  super__Vector_base<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

PostModel::PostModel()
{
}